

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bompiprobe.c
# Opt level: O3

int measure_lincost(int pid,int nprocs,int repeat,int msg_size,int total_size,int min_niters,
                   int niters,int ncomms,conf_interval_method_t conf_interval_method,int *n_samples,
                   char *sample_file_name,double *alpha_msg,double *alpha_msg_min,
                   double *alpha_msg_max,double *alpha_rma,double *alpha_rma_min,
                   double *alpha_rma_max,double *beta_msg,double *beta_msg_min,double *beta_msg_max,
                   double *beta_rma,double *beta_rma_min,double *beta_rma_max,double *beta_memcpy,
                   double *beta_memcpy_min,double *beta_memcpy_max,double conf_level)

{
  int size;
  int iVar1;
  MPI_Comm comm;
  bool bVar2;
  void *data;
  char *__s;
  FILE *pFVar3;
  MPI_Request *ppoVar4;
  void *pvVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  double *pdVar12;
  int iVar13;
  undefined4 in_register_00000034;
  undefined8 *puVar14;
  undefined4 *puVar15;
  uint *puVar16;
  long lVar17;
  size_t __nmemb;
  size_t __nmemb_00;
  char *pcVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar36;
  undefined1 auVar32 [16];
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double T_max [6];
  double T_min [6];
  double T [6];
  int o [7];
  undefined8 in_stack_fffffffffffffe38;
  uint local_1a0;
  uint local_19c;
  size_t local_198;
  int local_190;
  int local_18c;
  void *local_188;
  undefined8 *local_180;
  double local_178;
  char *local_170;
  char *local_168;
  double local_160;
  undefined1 local_158 [16];
  ulong local_140;
  ulong local_138;
  void *local_130;
  undefined8 *local_128;
  ulong local_120;
  MPI_Request *local_118;
  int local_10c;
  double local_108;
  size_t local_100;
  size_t local_f8;
  FILE *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_58;
  uint auStack_54 [9];
  
  local_158._8_8_ = local_158._0_8_;
  local_158._4_4_ = in_register_00000034;
  local_158._0_4_ = nprocs;
  local_198 = 0;
  local_1a0 = 0;
  local_178 = (double)((long)total_size / (long)msg_size & 0xffffffff);
  *n_samples = 0;
  local_18c = pid;
  local_10c = min_niters;
  local_108 = conf_level;
  if (sample_file_name == (char *)0x0 || pid != 0) {
    local_19c = 0;
LAB_001087ac:
    pFVar3 = (FILE *)0x0;
  }
  else {
    pFVar3 = fopen(sample_file_name,"w");
    if (pFVar3 == (FILE *)0x0) {
      local_19c = 1;
      goto LAB_001087ac;
    }
    fwrite("#ID\tSTAMP\tMETHOD\tTOPOLOGY\tMSG_SIZE\tH_REL\tTIME\n",0x2e,1,pFVar3);
    local_19c = 0;
  }
  MPI_Allreduce(&local_19c,&local_1a0,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  if (local_1a0 != 0) {
    if (local_18c != 0) {
      return 1;
    }
    fprintf(_stderr,"Could not open file \'%s\' for writing sample data\n",sample_file_name);
    return 1;
  }
  local_138 = CONCAT44(local_138._4_4_,total_size * 2);
  __nmemb = (size_t)(total_size * 2);
  local_190 = repeat;
  local_140 = (ulong)(uint)msg_size;
  local_f0 = pFVar3;
  local_170 = (char *)calloc(__nmemb,1);
  local_168 = (char *)calloc(__nmemb,1);
  local_130 = (void *)(long)niters;
  local_188 = calloc((size_t)local_130,0x28);
  local_160 = (double)(long)(SUB84(local_178,0) * 2);
  ppoVar4 = (MPI_Request *)calloc((size_t)local_160,8);
  local_f8 = (size_t)(int)local_158._0_4_;
  pvVar5 = calloc(local_f8,4);
  __nmemb_00 = (size_t)ncomms;
  puVar6 = (undefined8 *)calloc(__nmemb_00,8);
  uVar8 = 8;
  local_180 = (undefined8 *)calloc(__nmemb_00,8);
  __s = local_168;
  pcVar18 = local_170;
  auVar23 = _DAT_00119080;
  auVar28 = _DAT_00119070;
  local_120 = (ulong)(uint)ncomms;
  if (0 < ncomms && local_180 != (undefined8 *)0x0) {
    lVar9 = local_120 - 1;
    auVar20._8_4_ = (int)lVar9;
    auVar20._0_8_ = lVar9;
    auVar20._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar20 = auVar20 ^ _DAT_00119070;
    auVar30._8_4_ = 0xffffffff;
    auVar30._0_8_ = 0xffffffffffffffff;
    auVar30._12_4_ = 0xffffffff;
    auVar33 = _DAT_00119060;
    do {
      auVar32 = auVar33 ^ auVar28;
      auVar38._0_4_ = -(uint)(auVar20._0_4_ < auVar32._0_4_);
      auVar38._4_4_ = -(uint)(auVar20._4_4_ < auVar32._4_4_);
      auVar38._8_4_ = -(uint)(auVar20._8_4_ < auVar32._8_4_);
      auVar38._12_4_ = -(uint)(auVar20._12_4_ < auVar32._12_4_);
      iVar36 = -(uint)(auVar32._4_4_ == auVar20._4_4_);
      iVar37 = -(uint)(auVar32._12_4_ == auVar20._12_4_);
      auVar40._4_4_ = iVar36;
      auVar40._0_4_ = iVar36;
      auVar40._8_4_ = iVar37;
      auVar40._12_4_ = iVar37;
      auVar32._4_4_ = auVar38._4_4_;
      auVar32._0_4_ = auVar38._4_4_;
      auVar32._8_4_ = auVar38._12_4_;
      auVar32._12_4_ = auVar38._12_4_;
      auVar32 = auVar32 | auVar40 & auVar38;
      if ((~auVar32._0_4_ & 1) != 0) {
        *(undefined **)((long)local_180 + lVar9) = &ompi_mpi_comm_null;
      }
      auVar32 = auVar32 ^ auVar30;
      puVar14 = (undefined8 *)(ulong)auVar32._8_2_;
      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined **)((long)local_180 + lVar9 + 8) = &ompi_mpi_comm_null;
        puVar14 = local_180;
      }
      uVar8 = (uint)puVar14;
      lVar17 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + auVar23._0_8_;
      auVar33._8_8_ = lVar17 + auVar23._8_8_;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(ncomms + 1U >> 1) << 4 != lVar9);
  }
  auVar23 = _DAT_00119080;
  auVar28 = _DAT_00119070;
  if (puVar6 != (undefined8 *)0x0 && 0 < ncomms) {
    lVar9 = local_120 - 1;
    auVar21._8_4_ = (int)lVar9;
    auVar21._0_8_ = lVar9;
    auVar21._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar21 = auVar21 ^ _DAT_00119070;
    auVar31._8_4_ = 0xffffffff;
    auVar31._0_8_ = 0xffffffffffffffff;
    auVar31._12_4_ = 0xffffffff;
    auVar27 = _DAT_00119060;
    do {
      auVar33 = auVar27 ^ auVar28;
      auVar39._0_4_ = -(uint)(auVar21._0_4_ < auVar33._0_4_);
      auVar39._4_4_ = -(uint)(auVar21._4_4_ < auVar33._4_4_);
      auVar39._8_4_ = -(uint)(auVar21._8_4_ < auVar33._8_4_);
      auVar39._12_4_ = -(uint)(auVar21._12_4_ < auVar33._12_4_);
      iVar36 = -(uint)(auVar33._4_4_ == auVar21._4_4_);
      iVar37 = -(uint)(auVar33._12_4_ == auVar21._12_4_);
      auVar41._4_4_ = iVar36;
      auVar41._0_4_ = iVar36;
      auVar41._8_4_ = iVar37;
      auVar41._12_4_ = iVar37;
      auVar34._4_4_ = auVar39._4_4_;
      auVar34._0_4_ = auVar39._4_4_;
      auVar34._8_4_ = auVar39._12_4_;
      auVar34._12_4_ = auVar39._12_4_;
      auVar34 = auVar34 | auVar41 & auVar39;
      if ((~auVar34._0_4_ & 1) != 0) {
        *(undefined **)((long)puVar6 + lVar9) = &ompi_mpi_win_null;
      }
      auVar34 = auVar34 ^ auVar31;
      uVar8 = (uint)auVar34._8_2_;
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined **)((long)puVar6 + lVar9 + 8) = &ompi_mpi_win_null;
      }
      lVar17 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + auVar23._0_8_;
      auVar27._8_8_ = lVar17 + auVar23._8_8_;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(ncomms + 1U >> 1) << 4 != lVar9);
  }
  auVar28._0_4_ = -(uint)((int)((ulong)local_170 >> 0x20) == 0 && (int)local_170 == 0);
  auVar28._4_4_ = -(uint)((int)local_168 == 0 && (int)((ulong)local_168 >> 0x20) == 0);
  auVar28._8_4_ = -(uint)((int)local_188 == 0 && (int)((ulong)local_188 >> 0x20) == 0);
  auVar28._12_4_ = -(uint)((int)ppoVar4 == 0 && (int)((ulong)ppoVar4 >> 0x20) == 0);
  iVar36 = movmskps(uVar8,auVar28);
  local_19c = (uint)(((local_180 == (undefined8 *)0x0 || puVar6 == (undefined8 *)0x0) ||
                     pvVar5 == (void *)0x0) || iVar36 != 0);
  local_118 = ppoVar4;
  local_100 = __nmemb_00;
  MPI_Allreduce(&local_19c,&local_1a0,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  local_128 = puVar6;
  if (local_1a0 != 0) {
    if (local_18c == 0) {
      fprintf(_stderr,
              "Insufficient memory. For a benchmark on %d processes I require 2x %d bytes of memory for send and receive buffers, %ld bytes for storing the measurements, %ld bytes for the request queue, %ld bytes for communication infrastructure\n"
              ,local_f8,local_138 & 0xffffffff,(long)local_130 * 0x28,(long)local_160 << 3,
              local_100 * 0x10 + local_f8 * 4);
    }
    goto LAB_001096d3;
  }
  memset(pcVar18,1,__nmemb);
  memset(__s,2,__nmemb);
  puVar14 = local_180;
  auVar23 = _DAT_00119080;
  auVar28 = _DAT_00119070;
  if (0 < local_158._0_4_) {
    lVar9 = (local_158._0_8_ & 0xffffffff) - 1;
    auVar22._8_4_ = (int)lVar9;
    auVar22._0_8_ = lVar9;
    auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar7 = 0;
    auVar22 = auVar22 ^ _DAT_00119070;
    auVar29 = _DAT_00119060;
    do {
      bVar2 = auVar22._0_4_ < SUB164(auVar29 ^ auVar28,0);
      iVar36 = auVar22._4_4_;
      iVar37 = SUB164(auVar29 ^ auVar28,4);
      if ((bool)(~(iVar36 < iVar37 || iVar37 == iVar36 && bVar2) & 1)) {
        *(int *)((long)pvVar5 + uVar7 * 4) = (int)uVar7;
      }
      if (iVar36 >= iVar37 && (iVar37 != iVar36 || !bVar2)) {
        *(int *)((long)pvVar5 + uVar7 * 4 + 4) = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar9 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + auVar23._0_8_;
      auVar29._8_8_ = lVar9 + auVar23._8_8_;
    } while ((local_158._0_4_ + 1U & 0xfffffffe) != uVar7);
  }
  MPI_Comm_dup(&ompi_mpi_comm_world,local_180);
  MPI_Win_create(__s,__nmemb,1,&ompi_mpi_info_null,*puVar14,puVar6);
  local_138 = __nmemb;
  if (1 < ncomms) {
    local_160 = (double)(long)local_18c;
    lVar9 = local_120 * 8;
    lVar17 = 8;
    do {
      permute(&local_198,pvVar5,local_158._0_4_,4);
      MPI_Comm_split(*puVar14,0,*(undefined4 *)((long)pvVar5 + (long)local_160 * 4),
                     lVar17 + (long)puVar14);
      MPI_Win_create(__s,local_138,1,&ompi_mpi_info_null,*(undefined8 *)((long)puVar14 + lVar17),
                     (long)puVar6 + lVar17);
      lVar17 = lVar17 + 8;
    } while (lVar9 - lVar17 != 0);
  }
  data = local_188;
  auVar28 = _DAT_00119070;
  local_130 = pvVar5;
  if (niters < 1) {
    permute(&local_198,local_188,niters,0x28);
LAB_00109031:
    pcVar18 = local_170;
    permute(&local_198,data,niters,0x28);
LAB_00109046:
    permute(&local_198,data,niters,0x28);
  }
  else {
    uVar7 = (ulong)(niters + 1U & 0xfffffffe);
    lVar9 = (ulong)(uint)niters - 1;
    auVar35._8_4_ = (int)lVar9;
    auVar35._0_8_ = lVar9;
    auVar35._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    local_158 = auVar35 ^ _DAT_00119070;
    auVar23 = _DAT_00119060;
    do {
      bVar2 = local_158._0_4_ < SUB164(auVar23 ^ auVar28,0);
      iVar36 = SUB164(auVar23 ^ auVar28,4);
      iVar37 = local_158._4_4_;
      if ((bool)(~(iVar37 < iVar36 || iVar36 == iVar37 && bVar2) & 1)) {
        *(int *)((long)local_188 + lVar9 + 0xc) = (int)local_140;
      }
      if (iVar37 >= iVar36 && (iVar36 != iVar37 || !bVar2)) {
        *(int *)((long)local_188 + lVar9 + 0x34) = (int)local_140 * 2;
      }
      lVar17 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar17 + 2;
      lVar9 = lVar9 + 0x50;
    } while ((ulong)(niters + 1U >> 1) * 0x50 != lVar9);
    permute(&local_198,local_188,niters,0x28);
    pcVar18 = local_170;
    auVar23 = _DAT_00119080;
    auVar28 = _DAT_00119070;
    if (niters < 1) goto LAB_00109031;
    iVar36 = SUB84(local_178,0) + 1;
    puVar15 = (undefined4 *)((long)data + 8);
    uVar10 = 0;
    auVar24 = _DAT_00119060;
    do {
      bVar2 = local_158._0_4_ < SUB164(auVar24 ^ auVar28,0);
      iVar37 = SUB164(auVar24 ^ auVar28,4);
      iVar13 = local_158._4_4_;
      if ((bool)(~(iVar13 < iVar37 || iVar37 == iVar13 && bVar2) & 1)) {
        *puVar15 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                        (long)iVar36);
      }
      if (iVar13 >= iVar37 && (iVar37 != iVar13 || !bVar2)) {
        puVar15[10] = ((int)uVar10 + 1) % iVar36;
      }
      uVar10 = uVar10 + 2;
      lVar9 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + auVar23._0_8_;
      auVar24._8_8_ = lVar9 + auVar23._8_8_;
      puVar15 = puVar15 + 0x14;
    } while (uVar7 != uVar10);
    permute(&local_198,data,niters,0x28);
    auVar28 = _DAT_00119070;
    if (niters < 1) goto LAB_00109046;
    puVar15 = (undefined4 *)((long)data + 0x10);
    uVar10 = 0;
    auVar25 = _DAT_00119060;
    do {
      bVar2 = (int)local_158._0_4_ < SUB164(auVar25 ^ auVar28,0);
      iVar36 = SUB164(auVar25 ^ auVar28,4);
      if ((bool)(~((int)local_158._4_4_ < iVar36 || iVar36 == local_158._4_4_ && bVar2) & 1)) {
        *puVar15 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                        (long)ncomms);
      }
      if ((int)local_158._4_4_ >= iVar36 && (iVar36 != local_158._4_4_ || !bVar2)) {
        puVar15[10] = ((int)uVar10 + 1) % ncomms;
      }
      uVar10 = uVar10 + 2;
      lVar9 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar9 + 2;
      puVar15 = puVar15 + 0x14;
    } while (uVar7 != uVar10);
    permute(&local_198,data,niters,0x28);
    auVar23 = _DAT_00119080;
    auVar28 = _DAT_00119070;
    if (0 < niters) {
      uVar8 = 1;
      uVar11 = 0;
      lVar9 = 0;
      auVar26 = _DAT_00119060;
      do {
        bVar2 = local_158._0_4_ < SUB164(auVar26 ^ auVar28,0);
        iVar36 = SUB164(auVar26 ^ auVar28,4);
        iVar37 = local_158._4_4_;
        if ((bool)(~(iVar37 < iVar36 || iVar36 == iVar37 && bVar2) & 1)) {
          *(uint *)((long)data + lVar9 + 0x14) = uVar11 % 3;
        }
        if (iVar37 >= iVar36 && (iVar36 != iVar37 || !bVar2)) {
          *(uint *)((long)data + lVar9 + 0x3c) = uVar8 % 3;
        }
        lVar17 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + auVar23._0_8_;
        auVar26._8_8_ = lVar17 + auVar23._8_8_;
        lVar9 = lVar9 + 0x50;
        uVar8 = uVar8 + 2;
        uVar11 = uVar11 + 2;
      } while ((ulong)(niters + 1U >> 1) * 0x50 != lVar9);
    }
  }
  permute(&local_198,data,niters,0x28);
  dVar19 = local_178;
  puVar6 = local_180;
  iVar36 = local_190;
  if (0 < ncomms) {
    iVar37 = (int)local_140 * 2;
    local_158._0_4_ = iVar37;
    uVar7 = 0;
    do {
      in_stack_fffffffffffffe38 = CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),iVar36);
      iVar13 = SUB84(dVar19,0);
      measure_hrel_msg((MPI_Comm)puVar6[uVar7],pcVar18,local_168,local_118,iVar13,iVar37,iVar36);
      measure_hrel_rma((MPI_Comm)puVar6[uVar7],(MPI_Win)local_128[uVar7],pcVar18,iVar13,iVar37,
                       iVar36);
      measure_hrel_memcpy((MPI_Comm)puVar6[uVar7],pcVar18,local_168,iVar13,iVar37,iVar36);
      uVar7 = uVar7 + 1;
    } while (local_120 != uVar7);
  }
  local_178 = 10.0;
  dVar19 = bsp_time();
  uVar7 = local_140;
  iVar36 = local_18c;
  if (0 < niters) {
    local_138 = (ulong)local_10c;
    pdVar12 = (double *)((long)local_188 + 0x20);
    iVar37 = -1;
    lVar9 = 0;
    local_158._0_8_ = dVar19;
    local_160 = dVar19;
    do {
      iVar13 = *(int *)(pdVar12 + -3);
      size = *(int *)((long)pdVar12 + -0x14);
      comm = (MPI_Comm)local_180[*(int *)(pdVar12 + -2)];
      iVar1 = *(int *)((long)pdVar12 + -0xc);
      if (iVar1 == 2) {
        dVar19 = measure_hrel_memcpy(comm,local_170,local_168,iVar13,size,local_190);
      }
      else if (iVar1 == 1) {
        in_stack_fffffffffffffe38 =
             CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),local_190);
        dVar19 = measure_hrel_msg(comm,local_170,local_168,local_118,iVar13,size,local_190);
      }
      else {
        dVar19 = INFINITY;
        if (iVar1 == 0) {
          dVar19 = measure_hrel_rma(comm,(MPI_Win)local_128[*(int *)(pdVar12 + -2)],local_170,iVar13
                                    ,size,local_190);
        }
      }
      pdVar12[-4] = dVar19;
      dVar19 = bsp_time();
      *pdVar12 = dVar19 - (double)local_158._0_8_;
      uVar8 = (uint)lVar9;
      *(uint *)(pdVar12 + -1) = uVar8;
      if ((iVar36 == 0) && (dVar19 = bsp_time(), 10.0 < dVar19 - local_160)) {
        dVar19 = bsp_time();
        printf("# Sample time remaining: %.0f seconds\n#    (Press CTRL+C to interrupt)\n",
               ((dVar19 - (double)local_158._0_8_) / (double)(int)uVar8) * (double)(niters + iVar37)
              );
        local_160 = bsp_time();
      }
      MPI_Allreduce(&s_interrupted,&local_1a0,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world)
      ;
      iVar13 = 8;
      uVar11 = niters;
      if ((long)local_138 < lVar9) {
        iVar13 = 0x1e;
        uVar11 = uVar8;
      }
      if (local_1a0 == 0) {
        iVar13 = 0;
        uVar11 = niters;
      }
      niters = uVar11;
      if (iVar13 != 0) {
        pvVar5 = local_130;
        if (iVar13 == 8) goto LAB_001096d3;
        if (iVar13 != 0x1e) {
          return niters;
        }
        break;
      }
      lVar9 = lVar9 + 1;
      iVar37 = iVar37 + -1;
      pdVar12 = pdVar12 + 5;
    } while (lVar9 < niters);
  }
  pFVar3 = local_f0;
  pvVar5 = local_188;
  iVar36 = (int)uVar7;
  local_178 = local_178 / (1.0 - local_108);
  if (local_f0 != (FILE *)0x0) {
    if (0 < niters) {
      lVar9 = 0;
      do {
        in_stack_fffffffffffffe38 =
             CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                      *(undefined4 *)((long)pvVar5 + lVar9 + 8));
        fprintf(pFVar3,"%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                *(undefined8 *)((long)pvVar5 + lVar9 + 0x20),*(undefined8 *)((long)pvVar5 + lVar9),
                (ulong)*(uint *)((long)pvVar5 + lVar9 + 0x18),
                (ulong)*(uint *)((long)pvVar5 + lVar9 + 0x14),
                (ulong)*(uint *)((long)pvVar5 + lVar9 + 0x10),
                (ulong)*(uint *)((long)pvVar5 + lVar9 + 0xc),in_stack_fffffffffffffe38);
        lVar9 = lVar9 + 0x28;
      } while ((ulong)(uint)niters * 0x28 != lVar9);
    }
    fclose(pFVar3);
    iVar36 = (int)local_140;
  }
  pvVar5 = local_188;
  iVar37 = (int)local_178;
  qsort(local_188,(long)niters,0x28,cmp_lincost_sample);
  local_58 = 0;
  uVar7 = 0;
  uVar8 = 0;
  do {
    uVar11 = uVar8;
    if ((int)uVar8 < niters) {
      puVar16 = (uint *)((long)pvVar5 + (long)(int)uVar8 * 0x28 + 0x14);
      lVar9 = 0;
      do {
        if ((puVar16[-2] != (((uint)uVar7 & 1) + 1) * iVar36) ||
           (*puVar16 != ((uint)(uVar7 >> 1) & 0x7fffffff))) {
          uVar11 = uVar8 - (int)lVar9;
          break;
        }
        lVar9 = lVar9 + -1;
        puVar16 = puVar16 + 10;
        uVar11 = niters;
      } while ((long)(int)uVar8 - (long)niters != lVar9);
    }
    uVar8 = uVar11;
    auStack_54[uVar7] = uVar8;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 6);
  local_19c = (*conf_interval_method)
                        (&local_198,local_188,0x28,lincost_samples_get_hrel_time,&local_58,6,
                         local_108,iVar37,&local_88,&local_b8,&local_e8);
  MPI_Allreduce(&local_19c,&local_1a0,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  pvVar5 = local_130;
  if (local_1a0 == 0) {
    *alpha_rma = (local_88 + local_88) - local_80;
    *alpha_rma_min = (local_b8 + local_b8) - local_e0;
    *alpha_rma_max = (local_e8 + local_e8) - local_b0;
    *alpha_msg = (local_78 + local_78) - local_70;
    *alpha_msg_min = (local_a8 + local_a8) - local_d0;
    dVar19 = (double)iVar36;
    *alpha_msg_max = (local_d8 + local_d8) - local_a0;
    *beta_rma = (local_80 - local_88) / dVar19;
    *beta_rma_min = (local_b0 - local_e8) / dVar19;
    *beta_rma_max = (local_e0 - local_b8) / dVar19;
    *beta_msg = (local_70 - local_78) / dVar19;
    *beta_msg_min = (local_a0 - local_d8) / dVar19;
    *beta_msg_max = (local_d0 - local_a8) / dVar19;
    *beta_memcpy = (local_60 - local_68) / dVar19;
    *beta_memcpy_min = (local_90 - local_c8) / dVar19;
    *beta_memcpy_max = (local_c0 - local_98) / dVar19;
    *n_samples = niters;
  }
LAB_001096d3:
  uVar7 = local_120;
  puVar6 = local_128;
  puVar14 = local_180;
  if (0 < ncomms) {
    do {
      if ((undefined *)*puVar6 != &ompi_mpi_win_null) {
        MPI_Win_free(puVar6);
      }
      if ((undefined *)*puVar14 != &ompi_mpi_comm_null) {
        MPI_Comm_free(puVar14);
      }
      uVar7 = uVar7 - 1;
      puVar6 = puVar6 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar7 != 0);
  }
  free(local_170);
  free(local_168);
  free(local_188);
  free(local_118);
  free(local_180);
  free(pvVar5);
  free(local_128);
  return local_1a0;
}

Assistant:

int measure_lincost( int pid, int nprocs, int repeat,
        int msg_size, int total_size, int min_niters, int niters, int ncomms,
        conf_interval_method_t conf_interval_method,
        int * n_samples, 
        const char * sample_file_name,
        double * alpha_msg, double * alpha_msg_min, double * alpha_msg_max, 
        double * alpha_rma, double * alpha_rma_min, double * alpha_rma_max, 
        double * beta_msg, double * beta_msg_min, double * beta_msg_max,
        double * beta_rma, double * beta_rma_min, double * beta_rma_max,
        double * beta_memcpy, double *beta_memcpy_min, double *beta_memcpy_max,
        double conf_level )
{
    char * sendbuf, * recvbuf;
    lincost_sample_t * samples;
    size_t rng = 0;
    int i, k, my_error=0, glob_error=0;
    MPI_Request * reqs = 0; 
    int * pid_perms;
    MPI_Win * wins;  MPI_Comm * comms;
    const int n_avgs = (int) (10.0 / (1.0 - conf_level));
    const int max_h = total_size / msg_size;
    int o[7];  /* two methods x two msg sizes + 1 */
    double T[6], T_min[6], T_max[6]; /* two methods x two msg sizes */
    FILE * sample_file;
    double t0, t1;

    * n_samples = 0;

    if ( pid == 0 && sample_file_name ) {
        sample_file = fopen( sample_file_name, "w" );
        if (sample_file) {
            fprintf( sample_file, "#ID\tSTAMP\tMETHOD\tTOPOLOGY\t"
                                  "MSG_SIZE\tH_REL\tTIME\n" );
            my_error = 0;
        }
        else {
            my_error = 1;
        }
    }
    else {
        sample_file = NULL;
        my_error = 0;
    }

    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Could not open file '%s' for writing sample data\n",
                sample_file_name );
        return 1;
    }
 

    /* allocate memory */
    sendbuf = calloc( 2* total_size, 1 );
    recvbuf = calloc( 2* total_size, 1 );
    samples =  calloc( niters, sizeof(samples[0]) );
    reqs = calloc( 2*max_h, sizeof(MPI_Request) );
    pid_perms = calloc( nprocs, sizeof(pid_perms[0]) );
    wins = calloc( ncomms, sizeof(MPI_Win) );
    comms = calloc( ncomms, sizeof(MPI_Comm) ); 

    if (comms) {
        for ( i = 0; i < ncomms; ++i )
            comms[i] = MPI_COMM_NULL;
    }
    if (wins) { 
        for ( i = 0; i < ncomms; ++i) 
            wins[i] = MPI_WIN_NULL;
    }

    my_error = !sendbuf || !recvbuf || !samples || !reqs
            || !pid_perms || !wins || !comms;
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Insufficient memory. For a benchmark on "
                "%d processes I require 2x %d bytes of memory "
                "for send and receive buffers, %ld bytes for "
                "storing the measurements, %ld bytes for "
                "the request queue, %ld bytes for "
                "communication infrastructure\n",
                nprocs,  2*total_size,
                (long) niters * (long) sizeof(samples[0]),
                2*max_h * (long) sizeof(MPI_Request),
               ncomms * (long) sizeof(MPI_Win) +
               ncomms * (long) sizeof(MPI_Comm) +
               nprocs * (long) sizeof(pid_perms[0]) );
        goto exit;
    }

    memset( sendbuf, 1, 2*total_size );
    memset( recvbuf, 2, 2*total_size );

    /* Create random topologies */
    for ( i = 0 ; i < nprocs; ++i )
        pid_perms[i] = i;

    MPI_Comm_dup( MPI_COMM_WORLD, &comms[0] );
    MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[0], & wins[0] );

    for ( i = 1; i < ncomms; ++i ) {
        permute( &rng, pid_perms, nprocs, sizeof(pid_perms[0]) );

        MPI_Comm_split( comms[0], 0, pid_perms[pid], &comms[i] );
        MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[i], & wins[i] );
    }

    /* Create measurement points */
    for ( i = 0 ; i < niters; ++i )
        samples[i].msg_size = (i%2 + 1) * msg_size;

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i ) 
        samples[i].h = i % ( max_h + 1);

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i )
       samples[i].comm = i % ncomms; 

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0 ; i < niters; ++i )
        samples[i].method = i % 3;

    permute( &rng, samples, niters, sizeof(samples[0]) );


    /* Warm up */
    for ( i = 0; i < ncomms; ++i ) {
        measure_hrel_msg( comms[i], sendbuf, recvbuf, reqs, 
                max_h, 2*msg_size, repeat );
        measure_hrel_rma( comms[i], wins[i], sendbuf, 
                max_h, 2*msg_size, repeat );
        measure_hrel_memcpy( comms[i], sendbuf, recvbuf, 
                max_h, 2*msg_size, repeat );
    }

    /* And now the measurements */
    t0 = t1 = bsp_time();
    for ( i = 0; i < niters; ++i ) {
        double t = HUGE_VAL;
        int h    = samples[i].h;
        int size = samples[i].msg_size;
        MPI_Comm comm = comms[ samples[i].comm ];
        MPI_Win win = wins[ samples[i].comm ];

        switch( samples[i].method ) {
            case 0: t = measure_hrel_rma( comm, win, sendbuf, 
                                          h, size, repeat );
                    break;
            case 1: t = measure_hrel_msg( comm, sendbuf, recvbuf, reqs, 
                                          h, size, repeat );
                    break;
            case 2: t = measure_hrel_memcpy( comm, sendbuf, recvbuf,
                                          h, size, repeat );
                    break;
        }

        samples[i].time = t;
        samples[i].timestamp = bsp_time() - t0;
        samples[i].serial = i;

        if ( !pid && bsp_time() - t1 > 10.0 ) {
            printf("# Sample time remaining: %.0f seconds\n"
                   "#    (Press CTRL+C to interrupt)\n",
                    (bsp_time() - t0) / i *(niters - i - 1) );
            t1 = bsp_time();
        }

        MPI_Allreduce( &s_interrupted, &glob_error, 1, MPI_INT,
                MPI_MAX, MPI_COMM_WORLD );
        if ( glob_error ) { 
            if (i > min_niters) {
                niters = i;
                break;
            }
            else {
                goto exit;
            }
        }
    } 

    /* Saving data */
    if (sample_file) {
        for ( i = 0; i < niters; ++i ) {
            fprintf( sample_file, 
                      "%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                      samples[i].serial, samples[i].timestamp,
                      samples[i].method, samples[i].comm,
                      samples[i].msg_size, samples[i].h, samples[i].time );
        }
        fclose( sample_file );
        sample_file = NULL;
    }

    /* Analysis */

    /* sort on (msg_size, method) */
    qsort( samples, niters, sizeof(samples[0]), cmp_lincost_sample );
    
    /* create an index to each (msg_size, method) in array 'o' */
    o[0] = 0;
    i = 0;
    for ( k = 0; k < 6; ++k ) {
        for ( ; i < niters; ++i )
            if (samples[i].msg_size != (k%2+1)*msg_size
                || samples[i].method != (k/2) )
                break;

        o[k+1] = i;
    }
 
    my_error = (*conf_interval_method)( &rng, samples, sizeof(samples[0]), 
           lincost_samples_get_hrel_time, 
           o, 6, conf_level, n_avgs,
           T, T_min, T_max );
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if (glob_error) {
        goto exit;
    }
   
    /* saving results */
    *alpha_rma     = 2*T[0] - T[1];
    *alpha_rma_min = 2*T_min[0] - T_max[1];
    *alpha_rma_max = 2*T_max[0] - T_min[1];

    *alpha_msg     = 2*T[2] - T[3];
    *alpha_msg_min = 2*T_min[2] - T_max[3];
    *alpha_msg_max = 2*T_max[2] - T_min[3];

    *beta_rma = (T[1] - T[0])/msg_size ;
    *beta_rma_min = (T_min[1] - T_max[0])/msg_size;
    *beta_rma_max = (T_max[1] - T_min[0])/msg_size;

    *beta_msg = (T[3] - T[2])/msg_size ;
    *beta_msg_min = (T_min[3] - T_max[2])/msg_size;
    *beta_msg_max = (T_max[3] - T_min[2])/msg_size;

    *beta_memcpy = (T[5] - T[4])/msg_size ;
    *beta_memcpy_min = (T_min[5] - T_max[4])/msg_size;
    *beta_memcpy_max = (T_max[5] - T_min[4])/msg_size;

    *n_samples = niters;

exit:
    /* free resources */
    for ( i = 0; i < ncomms; ++i ) {
        if (wins[i] != MPI_WIN_NULL)
            MPI_Win_free( &wins[i] );

        if (comms[i] != MPI_COMM_NULL )
            MPI_Comm_free( &comms[i] );
    }

    free( sendbuf );
    free( recvbuf );
    free( samples );
    free( reqs );
    free( comms );
    free( pid_perms );
    free( wins );
    
    return glob_error;
}